

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>_>
::_insert_boundary(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>_>
                   *this,Index currentIndex)

{
  ID_index IVar1;
  uint uVar2;
  int iVar3;
  Column *this_00;
  size_type sVar4;
  uint local_34;
  ID_index local_30;
  Index local_2c;
  ID_index pivot;
  size_type local_20;
  Index local_14;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>_>
  *pRStack_10;
  Index currentIndex_local;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>_>
  *this_local;
  
  _pivot = &local_2c;
  local_20 = 1;
  local_2c = currentIndex;
  local_14 = currentIndex;
  pRStack_10 = this;
  Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false>>>
  ::insert_column<std::initializer_list<unsigned_int>>
            ((Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false>>>
              *)&this->mirrorMatrixU_,(initializer_list<unsigned_int> *)&pivot);
  this_00 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>_>
            ::get_column(&this->reducedMatrixR_,local_14);
  IVar1 = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>_>
          ::get_pivot(this_00);
  local_30 = IVar1;
  uVar2 = Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>
          ::get_null_value<unsigned_int>();
  if (IVar1 != uVar2) {
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&this->pivotToColumnIndex_);
    if (sVar4 <= local_30) {
      iVar3 = local_30 + 1;
      local_34 = Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>
                 ::get_null_value<unsigned_int>();
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this->pivotToColumnIndex_,(ulong)(uint)(iVar3 * 2),&local_34);
    }
  }
  _reduce_last_column(this,local_14);
  this->nextEventIndex_ = this->nextEventIndex_ + 1;
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_insert_boundary(Index currentIndex)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    mirrorMatrixU_.insert_column({currentIndex});
  } else {
    mirrorMatrixU_.insert_column({{currentIndex, 1}});
  }

  if constexpr (!Master_matrix::Option_list::has_map_column_container) {
    ID_index pivot = reducedMatrixR_.get_column(currentIndex).get_pivot();
    if (pivot != Master_matrix::template get_null_value<ID_index>() && pivotToColumnIndex_.size() <= pivot)
      pivotToColumnIndex_.resize((pivot + 1) * 2, Master_matrix::template get_null_value<Index>());
  }

  _reduce_last_column(currentIndex);
  ++nextEventIndex_;
}